

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::ImageViewCreateInfo::ImageViewCreateInfo
          (ImageViewCreateInfo *this,VkImage _image,VkImageViewType _viewType,VkFormat _format,
          VkImageSubresourceRange *_subresourceRange,VkComponentMapping *_components,
          VkImageViewCreateFlags _flags)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  
  (this->super_VkImageViewCreateInfo).sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  (this->super_VkImageViewCreateInfo).pNext = (void *)0x0;
  (this->super_VkImageViewCreateInfo).flags = 0;
  (this->super_VkImageViewCreateInfo).image.m_internal = _image.m_internal;
  (this->super_VkImageViewCreateInfo).viewType = _viewType;
  (this->super_VkImageViewCreateInfo).format = _format;
  (this->super_VkImageViewCreateInfo).components.r = _components->r;
  (this->super_VkImageViewCreateInfo).components.g = _components->g;
  (this->super_VkImageViewCreateInfo).components.b = _components->b;
  (this->super_VkImageViewCreateInfo).components.a = _components->a;
  dVar1 = _subresourceRange->baseMipLevel;
  dVar2 = _subresourceRange->levelCount;
  dVar3 = _subresourceRange->baseArrayLayer;
  (this->super_VkImageViewCreateInfo).subresourceRange.aspectMask = _subresourceRange->aspectMask;
  (this->super_VkImageViewCreateInfo).subresourceRange.baseMipLevel = dVar1;
  (this->super_VkImageViewCreateInfo).subresourceRange.levelCount = dVar2;
  (this->super_VkImageViewCreateInfo).subresourceRange.baseArrayLayer = dVar3;
  (this->super_VkImageViewCreateInfo).subresourceRange.layerCount = _subresourceRange->layerCount;
  (this->super_VkImageViewCreateInfo).flags = _flags;
  return;
}

Assistant:

ImageViewCreateInfo::ImageViewCreateInfo (vk::VkImage							_image,
										  vk::VkImageViewType					_viewType,
										  vk::VkFormat							_format,
										  const vk::VkImageSubresourceRange&	_subresourceRange,
										  const vk::VkComponentMapping&			_components,
										  vk::VkImageViewCreateFlags			_flags)
{
	sType = vk::VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
	pNext = DE_NULL;
	flags				= 0u;
	image				= _image;
	viewType			= _viewType;
	format				= _format;
	components.r		= _components.r;
	components.g		= _components.g;
	components.b		= _components.b;
	components.a		= _components.a;
	subresourceRange	= _subresourceRange;
	flags				= _flags;
}